

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_panel.cpp
# Opt level: O0

void get_inter_value_from_panel_value(Am_Value *panel_value,Am_Object *panel,Am_Value *value)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  int panel_value_found_count;
  bool found_it;
  bool is_list;
  Am_Object item;
  Am_Object inter;
  Am_Value label_or_id;
  Am_Value v;
  Am_Value_List inter_value_list;
  undefined1 local_40 [8];
  Am_Value_List panel_value_list;
  Am_Value_List parts;
  Am_Value *value_local;
  Am_Object *panel_local;
  Am_Value *panel_value_local;
  
  Am_Value_List::Am_Value_List((Am_Value_List *)&panel_value_list.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_40);
  Am_Value_List::Am_Value_List((Am_Value_List *)&v.value);
  Am_Value::Am_Value((Am_Value *)&label_or_id.value);
  Am_Value::Am_Value((Am_Value *)&inter);
  Am_Object::Am_Object(&item);
  Am_Object::Am_Object((Am_Object *)&panel_value_found_count);
  bVar1 = false;
  pAVar3 = Am_Object::Peek(panel,0x82,0);
  Am_Value::operator=((Am_Value *)&label_or_id.value,pAVar3);
  bVar2 = Am_Value::Valid((Am_Value *)&label_or_id.value);
  if (bVar2) {
    Am_Value_List::operator=((Am_Value_List *)&panel_value_list.item,(Am_Value *)&label_or_id.value)
    ;
    Am_Value::operator=(value,0);
    bVar2 = Am_Value::Valid(panel_value);
    if ((bVar2) && (bVar2 = Am_Value_List::Test(panel_value), bVar2)) {
      Am_Value_List::operator=((Am_Value_List *)local_40,panel_value);
      bVar1 = true;
    }
    Am_Value_List::Start((Am_Value_List *)&panel_value_list.item);
    while (bVar2 = Am_Value_List::Last((Am_Value_List *)&panel_value_list.item),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      pAVar3 = Am_Value_List::Get((Am_Value_List *)&panel_value_list.item);
      Am_Object::operator=((Am_Object *)&panel_value_found_count,pAVar3);
      pAVar3 = Am_Object::Peek((Am_Object *)&panel_value_found_count,0x1af,0);
      Am_Value::operator=((Am_Value *)&inter,pAVar3);
      if (bVar1) {
        Am_Value_List::Start((Am_Value_List *)local_40);
        bVar2 = Am_Value_List::Member((Am_Value_List *)local_40,(Am_Value *)&inter);
        if (bVar2) {
          Am_Object::Set((Am_Object *)&panel_value_found_count,0x172,true,0);
          pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&panel_value_found_count);
          Am_Value_List::Add((Am_Value_List *)&v.value,pAVar4,Am_TAIL,true);
        }
        else {
          Am_Object::Set((Am_Object *)&panel_value_found_count,0x172,false,0);
        }
      }
      else {
        bVar2 = Am_Value::operator==(panel_value,(Am_Value *)&inter);
        if (bVar2) {
          Am_Object::Set((Am_Object *)&panel_value_found_count,0x172,true,0);
          pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&panel_value_found_count);
          Am_Value::operator=(value,pAVar4);
        }
        else {
          Am_Object::Set((Am_Object *)&panel_value_found_count,0x172,false,0);
        }
      }
      Am_Value_List::Next((Am_Value_List *)&panel_value_list.item);
    }
    if (bVar1) {
      pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&v.value);
      Am_Value::operator=(value,pAVar4);
    }
  }
  Am_Object::~Am_Object((Am_Object *)&panel_value_found_count);
  Am_Object::~Am_Object(&item);
  Am_Value::~Am_Value((Am_Value *)&inter);
  Am_Value::~Am_Value((Am_Value *)&label_or_id.value);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&v.value);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_40);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&panel_value_list.item);
  return;
}

Assistant:

void
get_inter_value_from_panel_value(const Am_Value &panel_value,
                                 const Am_Object &panel, Am_Value &value)
{
  Am_Value_List parts, panel_value_list, inter_value_list;
  Am_Value v, label_or_id;
  Am_Object inter, item;
  bool is_list = false;
  bool found_it = false;
  int panel_value_found_count = 0;
  v = panel.Peek(Am_GRAPHICAL_PARTS);
  if (!v.Valid())
    return;
  parts = v;
  value = (0L); //initialize return value
  if (panel_value.Valid() && Am_Value_List::Test(panel_value)) { // is a list
    panel_value_list = panel_value;
    is_list = true;
  }
  for (parts.Start(); !parts.Last(); parts.Next()) {
    item = parts.Get();
    label_or_id = item.Peek(Am_LABEL_OR_ID);
    if (is_list) {
      panel_value_list.Start();
      if (panel_value_list.Member(label_or_id)) { // then this one should be on
        item.Set(Am_SELECTED, true);
        inter_value_list.Add(item);
        panel_value_found_count++;
      } else // this one should be off
        item.Set(Am_SELECTED, false);
    } else { // panel value not a list, should be Am_LABEL_OR_ID
      if (panel_value == label_or_id) { // then this one should be on
        item.Set(Am_SELECTED, true);
        value = item;
        found_it = true;
      } else // this one should be off
        item.Set(Am_SELECTED, false);
    }
  } // end for parts
  if (is_list) {
    value = inter_value_list;
#if 0 //this testing doesn't work, move to a Set_Type_Check
    int unused = panel_value_list.Length() - panel_value_found_count;
    if (unused != 0) {
     std::cerr << "** Amulet WARNING: Value List " << panel_value
	   << " which was set into widget "
	   << panel << " seems to contain " << unused
	   << " item(s) that do not match one the values in its "
	   "Am_ITEMS list.\n" <<std::flush;
    }
#endif
  } else {
#if 0 // this testing doesn't work, move to a Set_Type_Check **
    if( !found_it ) {
      // unfortunately, can't raise an error because panels are often
      // initialized with illegal values temporarily
      if (panel_value.Valid())) {
     std::cerr << "** Amulet WARNING: Value " << panel_value
	   << " (type=" << Am_Get_Type_Name(panel_value.type)
	   << ") which was set into widget " << panel
	  << " seems to not be one the values in its Am_ITEMS list\n" <<std::flush;
      }
      return;  // don't remove this line!
      // gcc 2.7.0 on HP requires it (otherwise compiler bug causes a crash)
      // -- rcm
    }
#endif
    return;
  }
}